

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::PackageExportDeclarationSyntax::PackageExportDeclarationSyntax
          (PackageExportDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *items,Token semi)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  PackageImportItemSyntax *pPVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *__range2;
  iterator_base<slang::syntax::PackageImportItemSyntax_*> local_30;
  
  uVar5 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,PackageExportDeclaration,attributes);
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  SVar2 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473860;
  sVar1 = (items->elements).size_;
  (this->items).elements.data_ = (items->elements).data_;
  (this->items).elements.size_ = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->items).elements.size_;
  local_30.list = &this->items;
  for (; (local_30.list != &this->items || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pPVar4 = SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::
             iterator_base<slang::syntax::PackageImportItemSyntax_*>::operator*(&local_30);
    (pPVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

PackageExportDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<PackageImportItemSyntax>& items, Token semi) :
        MemberSyntax(SyntaxKind::PackageExportDeclaration, attributes), keyword(keyword), items(items), semi(semi) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }